

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloca.hpp
# Opt level: O2

void __thiscall
libtorrent::aux::alloca_destructor<const_libtorrent::aux::piece_picker::downloading_piece_*>::
~alloca_destructor(alloca_destructor<const_libtorrent::aux::piece_picker::downloading_piece_*> *this
                  )

{
  downloading_piece **ppdVar1;
  
  if ((0x200 < (this->objects).m_len) &&
     (ppdVar1 = (this->objects).m_ptr, ppdVar1 != (downloading_piece **)0x0)) {
    operator_delete__(ppdVar1);
    return;
  }
  return;
}

Assistant:

~alloca_destructor()
	{
		if (objects.size() > cutoff)
		{
			delete [] objects.data();
		}
		else
		{
			for (auto& o : objects)
			{
				TORRENT_UNUSED(o);
				o.~T();
			}
		}
	}